

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XIncludeUtils.cpp
# Opt level: O3

XIncludeHistoryNode * __thiscall
xercesc_4_0::XIncludeUtils::popFromCurrentInclusionHistoryStack(XIncludeUtils *this,XMLCh *param_1)

{
  XIncludeHistoryNode *pXVar1;
  XIncludeHistoryNode *pXVar2;
  XIncludeUtils *pXVar3;
  XIncludeHistoryNode *buf;
  XIncludeHistoryNode *pXVar4;
  
  pXVar1 = this->fIncludeHistoryHead;
  pXVar2 = pXVar1;
  buf = pXVar1;
  if (pXVar1 != (XIncludeHistoryNode *)0x0) {
    do {
      pXVar4 = buf;
      buf = pXVar2;
      pXVar2 = buf->next;
    } while (buf->next != (XIncludeHistoryNode *)0x0);
    pXVar3 = (XIncludeUtils *)&pXVar4->next;
    if (buf == pXVar1) {
      pXVar3 = this;
    }
    pXVar3->fIncludeHistoryHead = (XIncludeHistoryNode *)0x0;
    XMLString::release(&buf->URI,XMLPlatformUtils::fgMemoryManager);
    (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[4])
              (XMLPlatformUtils::fgMemoryManager,buf);
  }
  return (XIncludeHistoryNode *)0x0;
}

Assistant:

XIncludeHistoryNode *
XIncludeUtils::popFromCurrentInclusionHistoryStack(const XMLCh * /*toPop*/){
    XIncludeHistoryNode *historyCursor = fIncludeHistoryHead;
    XIncludeHistoryNode *penultimateCursor = historyCursor;

    if (fIncludeHistoryHead == NULL){
        return NULL;
    }

    while (historyCursor->next != NULL){
        penultimateCursor = historyCursor;
        historyCursor = historyCursor->next;
    }

    if (historyCursor == fIncludeHistoryHead){
        fIncludeHistoryHead = NULL;
    } else {
        penultimateCursor->next = NULL;
    }

    XMLString::release(&(historyCursor->URI));
    XMLPlatformUtils::fgMemoryManager->deallocate((void *)historyCursor);
    return NULL;
}